

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O3

ostream * eglu::operator<<(ostream *str,ConfigAttribValueFmt *attribFmt)

{
  ostream *poVar1;
  Bitfield<16UL> local_28;
  
  switch(attribFmt->attribute) {
  case 0x3020:
  case 0x3021:
  case 0x3022:
  case 0x3023:
  case 0x3024:
  case 0x3025:
  case 0x3026:
  case 0x3028:
  case 0x3029:
  case 0x3031:
  case 0x3032:
  case 0x3035:
  case 0x3036:
  case 0x3037:
  case 0x303b:
  case 0x303c:
  case 0x303d:
  case 0x303e:
    poVar1 = (ostream *)std::ostream::operator<<(str,attribFmt->value);
    return poVar1;
  case 0x3027:
    local_28.m_begin._0_4_ = attribFmt->value;
    local_28.m_value = (deUint64)getConfigCaveatName;
    break;
  default:
    local_28.m_value = (deUint64)(uint)attribFmt->value;
    goto LAB_0043621e;
  case 0x302d:
  case 0x3039:
  case 0x303a:
    local_28.m_begin._0_4_ = attribFmt->value;
    local_28.m_value = (deUint64)getBoolDontCareName;
    break;
  case 0x3033:
    getSurfaceBitsStr(&local_28,attribFmt->value);
    goto LAB_00436259;
  case 0x3034:
    local_28.m_begin._0_4_ = attribFmt->value;
    local_28.m_value = (deUint64)getTransparentTypeName;
    break;
  case 0x303f:
    local_28.m_begin._0_4_ = attribFmt->value;
    local_28.m_value = (deUint64)getColorBufferTypeName;
    break;
  case 0x3040:
  case 0x3042:
    getAPIBitsStr(&local_28,attribFmt->value);
LAB_00436259:
    poVar1 = tcu::Format::Bitfield<16UL>::toStream(&local_28,str);
    return poVar1;
  case 0x3041:
    local_28.m_value = (deUint64)(uint)attribFmt->value;
    if (local_28.m_value == 0x3038) {
      std::__ostream_insert<char,std::char_traits<char>>(str,"EGL_NONE",8);
      return str;
    }
LAB_0043621e:
    poVar1 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_28,str);
    return poVar1;
  }
  poVar1 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_28,str);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConfigAttribValueFmt& attribFmt)
{
	switch (attribFmt.attribute)
	{
		case EGL_COLOR_BUFFER_TYPE:
			return str << getColorBufferTypeStr(attribFmt.value);

		case EGL_CONFIG_CAVEAT:
			return str << getConfigCaveatStr(attribFmt.value);

		case EGL_CONFORMANT:
		case EGL_RENDERABLE_TYPE:
			return str << getAPIBitsStr(attribFmt.value);

		case EGL_SURFACE_TYPE:
			return str << getSurfaceBitsStr(attribFmt.value);

		case EGL_MATCH_NATIVE_PIXMAP:
			if (attribFmt.value == EGL_NONE)
				return str << "EGL_NONE";
			else
				return str << tcu::toHex(attribFmt.value);

		case EGL_TRANSPARENT_TYPE:
			return str << getTransparentTypeStr(attribFmt.value);

		case EGL_BIND_TO_TEXTURE_RGB:
		case EGL_BIND_TO_TEXTURE_RGBA:
		case EGL_NATIVE_RENDERABLE:
			return str << getBoolDontCareStr(attribFmt.value);

		case EGL_ALPHA_MASK_SIZE:
		case EGL_ALPHA_SIZE:
		case EGL_BLUE_SIZE:
		case EGL_BUFFER_SIZE:
		case EGL_CONFIG_ID:
		case EGL_DEPTH_SIZE:
		case EGL_GREEN_SIZE:
		case EGL_LEVEL:
		case EGL_LUMINANCE_SIZE:
		case EGL_MAX_SWAP_INTERVAL:
		case EGL_MIN_SWAP_INTERVAL:
		case EGL_RED_SIZE:
		case EGL_SAMPLE_BUFFERS:
		case EGL_SAMPLES:
		case EGL_STENCIL_SIZE:
		case EGL_TRANSPARENT_RED_VALUE:
		case EGL_TRANSPARENT_GREEN_VALUE:
		case EGL_TRANSPARENT_BLUE_VALUE:
			return str << (int)attribFmt.value;

		default:
			return str << tcu::toHex(attribFmt.value);
	}
}